

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  int *piVar3;
  int i;
  int iVar4;
  int b;
  int a;
  int n;
  queue<int> q;
  int x;
  int local_54;
  int local_50;
  int local_4c;
  queue<int> local_48;
  int local_24;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105188) = 0;
  CP::queue<int>::queue(&local_48);
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_4c);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&local_50);
  std::istream::operator>>(piVar1,&local_54);
  for (iVar4 = 0; iVar4 < local_4c; iVar4 = iVar4 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_24);
    CP::queue<int>::push(&local_48,&local_24);
  }
  CP::queue<int>::reverse(&local_48,local_50,local_54);
  poVar2 = std::operator<<((ostream *)&std::cout,"size of q = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  while (local_48.mSize != 0) {
    piVar3 = CP::queue<int>::front(&local_48);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
    std::operator<<(poVar2," ");
    CP::queue<int>::pop(&local_48);
  }
  CP::queue<int>::~queue(&local_48);
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);cin.tie(0);

  int n,a,b;
  CP::queue<int> q;
  cin >> n >> a >> b;
  for (int i = 0;i < n;i++) {
    int x;
    cin >> x;
    q.push(x);
  }
  q.reverse(a,b);

  cout << "size of q = " << q.size() << endl;
  while (!q.empty()) {
    cout << q.front() << " ";
    q.pop();
  }
}